

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenId(Lexer *this)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  __tuple_element_t<1UL,_tuple<TokenType,_basic_string<char>_>_> *__lhs;
  Position *__args_2;
  Lexer *in_RSI;
  Position local_150;
  undefined1 local_132 [32];
  undefined1 local_112 [26];
  reference local_f8;
  tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tpl;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keywords;
  undefined1 local_a8 [42];
  undefined1 local_7e [30];
  Position local_60;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  string id;
  Lexer *this_local;
  
  std::__cxx11::string::string((string *)local_38);
  std::__cxx11::string::reserve((ulong)local_38);
  while (in_RSI->currentChar == 0x5f) {
    std::__cxx11::string::operator+=((string *)local_38,(char)in_RSI->currentChar);
    nextChar(in_RSI);
  }
  iVar3 = isdigit(in_RSI->currentChar);
  if (iVar3 == 0) {
    iVar3 = isalpha(in_RSI->currentChar);
    if (iVar3 == 0) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"_");
      if (bVar1) {
        local_7e._0_2_ = 0x5e;
        getCurrentCursor((Position *)(local_a8 + 0x10),in_RSI);
        std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
                  ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_7e);
        local_7e._2_4_ = 1;
      }
      else {
        local_a8._6_2_ = 2;
        local_a8._0_4_ = 2;
        getCurrentCursor((Position *)
                         &keywords.
                          super__Vector_base<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI);
        std::
        make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                  ((Level *)(local_a8 + 8),(LexerErrorCode *)(local_a8 + 6),(Position *)local_a8);
        generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                            *)in_RSI);
        std::
        unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                       *)(local_a8 + 8));
        local_7e._2_4_ = 1;
      }
    }
    else {
      while( true ) {
        bVar1 = true;
        if (in_RSI->currentChar != 0x5f) {
          iVar3 = isalnum(in_RSI->currentChar);
          bVar1 = iVar3 != 0;
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=((string *)local_38,(char)in_RSI->currentChar);
        nextChar(in_RSI);
      }
      uVar4 = std::__cxx11::string::size();
      if ((1 < uVar4) && (uVar4 = std::__cxx11::string::size(), uVar4 < 9)) {
        lVar5 = std::__cxx11::string::size();
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range2,
                 (vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(&DW_ref___gxx_personality_v0 + lVar5 * 3));
        __end2 = std::
                 vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2);
        tpl = (tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           *)&tpl), bVar1) {
          local_f8 = __gnu_cxx::
                     __normal_iterator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator*(&__end2);
          __lhs = std::get<1ul,pfederc::TokenType,std::__cxx11::string>(local_f8);
          _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38);
          if (_Var2) {
            __args_2 = (Position *)std::get<0ul,pfederc::TokenType,std::__cxx11::string>(local_f8);
            getCurrentCursor((Position *)(local_112 + 2),in_RSI);
            std::
            make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType_const&,pfederc::Position>
                      ((Token **)this,(TokenType *)&in_RSI->currentToken,__args_2);
            local_7e._2_4_ = 1;
            goto LAB_0011123d;
          }
          __gnu_cxx::
          __normal_iterator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&__end2);
        }
        local_7e._2_4_ = 0;
LAB_0011123d:
        std::
        vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<pfederc::TokenType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range2);
        if (local_7e._2_4_ != 0) goto LAB_00111338;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"null");
      if (bVar1) {
        local_112._0_2_ = 0x3e;
        getCurrentCursor((Position *)(local_132 + 2),in_RSI);
        std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
                  ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_112);
        local_7e._2_4_ = 1;
      }
      else {
        local_132._0_2_ = 5;
        getCurrentCursor(&local_150,in_RSI);
        std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
                  ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_132);
        local_7e._2_4_ = 1;
      }
    }
  }
  else {
    local_48._6_2_ = 2;
    local_48._0_4_ = 1;
    getCurrentCursor((Position *)(local_7e + 6),in_RSI);
    Position::Position(&local_60,local_7e._6_8_,in_RSI->currentEndIndex,in_RSI->currentEndIndex);
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)(local_48 + 8),(LexerErrorCode *)(local_48 + 6),(Position *)local_48);
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)(local_48 + 8));
    local_7e._2_4_ = 1;
  }
LAB_00111338:
  std::__cxx11::string::~string((string *)local_38);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenId() noexcept {
  std::string id;
  id.reserve(16);
  // eat _ (important for checking if followed by alphabetic char)
  while (currentChar == '_') {
    id += currentChar;
    nextChar();
  }
  // must be followed by alpha character or just valid _ (TokenType::TOK_ANY)
  if (isdigit(currentChar)) {
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));
  } else if (!isalpha(currentChar)) {
    // check for any
    if (id == "_")
      return std::make_unique<Token>(currentToken, TokenType::TOK_ANY, getCurrentCursor());
    // __+ is not allowed
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS, getCurrentCursor()));
  }

  while (currentChar == '_' || isalnum(currentChar)) {
    id += currentChar;
    nextChar();
  }

  // check if keword
  if (id.size() >= KEYWORDS_MIN_STRING_LENGTH
    && id.size() < KEYWORDS_MIN_STRING_LENGTH + KEYWORDS_LENGTH) {
    auto keywords = KEYWORDS[id.size() - KEYWORDS_MIN_STRING_LENGTH];
    for (const auto &tpl : keywords) {
      if (std::get<1>(tpl) == id)
        return std::make_unique<Token>(currentToken, std::get<0>(tpl), getCurrentCursor());
    }
  }
  // check if operator
  if (id == "null")
    return std::make_unique<Token>(currentToken, TokenType::TOK_OP_NULL, getCurrentCursor());

  return std::make_unique<Token>(currentToken, TokenType::TOK_ID, getCurrentCursor());
}